

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::tableJust(GrpParser *this)

{
  bool bVar1;
  int t;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp50_AST;
  RefAST tmp49_AST;
  RefAST tmp48_AST;
  RefAST tmp47_AST;
  RefAST tableJust_AST;
  ASTPair currentAST;
  ASTPair *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  ASTPair *in_stack_fffffffffffffed0;
  RefCount<AST> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  RefToken *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  Parser *in_stack_ffffffffffffff00;
  Parser *this_00;
  ASTPair *currentAST_00;
  ASTFactory *this_01;
  RefToken *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar5;
  undefined1 local_b8 [8];
  undefined1 local_b0 [31];
  undefined1 local_91;
  GrpParser *in_stack_ffffffffffffff70;
  GrpParser *in_stack_ffffffffffffff80;
  undefined1 local_60 [24];
  undefined1 local_48 [72];
  
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  ASTPair::ASTPair(in_stack_fffffffffffffed0);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffed0->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffed0->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  (**(code **)(*in_RDI + 0x28))(local_48,in_RDI,1);
  ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     in_stack_fffffffffffffef0);
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffec0->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffed0);
  Parser::match(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffed0->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  this_01 = (ASTFactory *)(in_RDI + 6);
  (**(code **)(*in_RDI + 0x28))(local_60,in_RDI,1);
  ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     in_stack_fffffffffffffef0);
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffec0->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffed0);
  currentAST_00 = (ASTPair *)(in_RDI + 6);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffed0->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  ASTFactory::addASTChild(this_01,currentAST_00,(RefAST *)in_stack_ffffffffffffff00);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffec0->root);
  Parser::match(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffed0->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  this_00 = (Parser *)(in_RDI + 6);
  (**(code **)(*in_RDI + 0x28))(&stack0xffffffffffffff80,in_RDI,1);
  ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     in_stack_fffffffffffffef0);
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffec0->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffed0);
  Parser::match(this_00,in_stack_fffffffffffffefc);
  t = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if ((t != 6) && (1 < t - 8U)) {
    if (t == 0xb) {
      directives(in_stack_ffffffffffffff80);
      in_stack_fffffffffffffef0 = (RefToken *)(in_RDI + 6);
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffed0->root,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      ASTFactory::addASTChild(this_01,currentAST_00,(RefAST *)this_00);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffec0->root);
    }
    else if ((((2 < t - 0xdU) && (5 < t - 0x1aU)) && (t != 0x26)) &&
            (((t != 0x28 && (t != 0x30)) && ((1 < t - 0x32U && (t != 0x35)))))) {
      local_91 = 1;
      uVar4 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(&stack0xffffffffffffff70,in_RDI,1);
      NoViableAltException::NoViableAltException
                ((NoViableAltException *)
                 CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
      local_91 = 0;
      __cxa_throw(uVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
  }
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar2 != 6) {
    if (iVar2 == 8) {
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffed0->root,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      in_stack_fffffffffffffed8 = (RefCount<AST> *)(in_RDI + 6);
      (**(code **)(*in_RDI + 0x28))(local_b0,in_RDI,1);
      ASTFactory::create((ASTFactory *)CONCAT44(t,in_stack_fffffffffffffef8),
                         in_stack_fffffffffffffef0);
      RefCount<AST>::operator=
                ((RefCount<AST> *)CONCAT44(iVar2,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffec0->root);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffed0);
      Parser::match(this_00,t);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffec0->root);
    }
    else if (((iVar2 != 9) && (2 < iVar2 - 0xdU)) &&
            ((5 < iVar2 - 0x1aU &&
             ((((iVar2 != 0x26 && (iVar2 != 0x28)) && (iVar2 != 0x30)) &&
              ((1 < iVar2 - 0x32U && (iVar2 != 0x35)))))))) {
      uVar5 = 1;
      uVar4 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_b8,in_RDI,1);
      NoViableAltException::NoViableAltException
                ((NoViableAltException *)CONCAT17(uVar5,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
      __cxa_throw(uVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
  }
  while( true ) {
    uVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    bVar1 = BitSet::member((BitSet *)CONCAT44(uVar3,in_stack_fffffffffffffec8),
                           (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    in_stack_fffffffffffffec8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffec8);
    if (!bVar1) break;
    subEntry(in_stack_ffffffffffffff70);
    in_stack_fffffffffffffec0 = (ASTPair *)(in_RDI + 6);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffed0->root,
               (RefCount<AST> *)CONCAT44(uVar3,in_stack_fffffffffffffec8));
    ASTFactory::addASTChild(this_01,currentAST_00,(RefAST *)this_00);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffec0->root);
  }
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(iVar2,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffec0->root);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffec0->root);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffec0->root);
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(iVar2,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffec0->root);
  ASTPair::~ASTPair(in_stack_fffffffffffffec0);
  return;
}

Assistant:

void GrpParser::tableJust() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST tableJust_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp47_AST = nullAST;
		tmp47_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		RefAST tmp48_AST = nullAST;
		tmp48_AST = astFactory.create(LT(1));
		astFactory.addASTChild(currentAST, tmp48_AST);
		match(LITERAL_justification);
		RefAST tmp49_AST = nullAST;
		tmp49_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		{
		switch ( LA(1)) {
		case OP_LBRACE:
		{
			directives();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_LPAREN:
		case OP_SEMI:
		case LITERAL_environment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		case LITERAL_pseudo:
		case LIT_UHEX:
		case LITERAL_codepoint:
		case LITERAL_glyphid:
		case LITERAL_postscript:
		case LITERAL_unicode:
		case LITERAL_pass:
		case LITERAL_if:
		case OP_LBRACKET:
		case OP_UNDER:
		case OP_AT:
		case OP_HASH:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp50_AST = nullAST;
			tmp50_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case OP_LPAREN:
		case LITERAL_environment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		case LITERAL_pseudo:
		case LIT_UHEX:
		case LITERAL_codepoint:
		case LITERAL_glyphid:
		case LITERAL_postscript:
		case LITERAL_unicode:
		case LITERAL_pass:
		case LITERAL_if:
		case OP_LBRACKET:
		case OP_UNDER:
		case OP_AT:
		case OP_HASH:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		do {
			if ((_tokenSet_12.member(LA(1)))) {
				subEntry();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else {
				goto _loop269;
			}
			
		} while (true);
		_loop269:;
		}
		tableJust_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_11);
	}
	returnAST = tableJust_AST;
}